

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

bool __thiscall soul::heart::PureFunctionCall::mayHaveSideEffects(PureFunctionCall *this)

{
  size_t sVar1;
  pool_ref<soul::heart::Expression> *ppVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  long lVar6;
  
  bVar3 = Function::mayHaveSideEffects(this->function);
  bVar4 = true;
  if (!bVar3) {
    sVar1 = (this->arguments).numActive;
    if (sVar1 == 0) {
      bVar4 = false;
    }
    else {
      ppVar2 = (this->arguments).items;
      lVar6 = 0;
      do {
        cVar5 = (**(code **)(**(long **)((long)&ppVar2->object + lVar6) + 0x50))();
        if (cVar5 != '\0') {
          return (bool)cVar5;
        }
        bVar3 = sVar1 * 8 + -8 != lVar6;
        bVar4 = false;
        lVar6 = lVar6 + 8;
      } while (bVar3);
    }
  }
  return bVar4;
}

Assistant:

bool mayHaveSideEffects() const override
        {
            if (function.mayHaveSideEffects())
                return true;

            for (auto a : arguments)
                if (a->mayHaveSideEffects())
                    return true;

            return false;
        }